

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsComponentAddDomain(FmsComponent comp,FmsDomain domain)

{
  FmsInt FVar1;
  FmsInt FVar2;
  ulong uVar3;
  int iVar4;
  FmsInt FVar5;
  _FmsPart_private *__ptr;
  long lVar6;
  long lVar7;
  
  if (comp == (FmsComponent)0x0) {
    return 1;
  }
  if (domain == (FmsDomain)0x0) {
    iVar4 = 2;
  }
  else {
    FVar1 = comp->dim;
    FVar2 = domain->dim;
    if (FVar1 == FVar2 || FVar1 == 0x7f) {
      uVar3 = comp->num_parts;
      __ptr = comp->parts;
      FVar5 = NextPow2(uVar3 + 1);
      if (uVar3 <= FVar5 >> 1) {
        __ptr = (_FmsPart_private *)realloc(__ptr,FVar5 * 0xe8);
        if (__ptr == (_FmsPart_private *)0x0) {
          return 4;
        }
        comp->parts = __ptr;
      }
      memset(__ptr[uVar3].num_entities,0,0xe0);
      __ptr[uVar3].domain = domain;
      FVar5 = comp->num_main_entities;
      for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
        lVar7 = *(long *)((long)domain->num_entities + lVar6);
        *(long *)((long)__ptr[uVar3].num_entities + lVar6) = lVar7;
        if (*(FmsInt *)((long)FmsEntityDim + lVar6) != FVar2) {
          lVar7 = 0;
        }
        FVar5 = FVar5 + lVar7;
      }
      if (FVar1 == 0x7f) {
        comp->dim = FVar2;
      }
      comp->num_main_entities = FVar5;
      comp->num_parts = uVar3 + 1;
      iVar4 = 0;
    }
    else {
      iVar4 = 3;
    }
  }
  return iVar4;
}

Assistant:

int FmsComponentAddDomain(FmsComponent comp, FmsDomain domain) {
  if (!comp) { E_RETURN(1); }
  if (!domain) { E_RETURN(2); }
  const FmsInt num_parts = comp->num_parts;
  const FmsInt comp_dim = comp->dim;
  const FmsInt dim = domain->dim;
  if (comp_dim != FMS_INVALID_DIM && comp_dim != dim) { E_RETURN(3); }
  struct _FmsPart_private *parts = comp->parts;
  // Reallocate comp->parts, if necessary
  FmsInt nc = NextPow2(num_parts + 1);
  if (num_parts <= nc/2) {
    parts = realloc(parts, nc*sizeof(*parts));
    if (parts == NULL) { E_RETURN(4); }
    comp->parts = parts;
  }
  struct _FmsPart_private *part = parts + num_parts;
  // Initialize part, counting the number of main entities
  memset(part, 0, sizeof(*part));
  part->domain = domain;
  FmsInt num_main_entities = comp->num_main_entities;
  for (FmsInt t = 0; t < FMS_NUM_ENTITY_TYPES; t++) {
    FmsInt num_entities = domain->num_entities[t];
    part->num_entities[t] = num_entities;
    if (FmsEntityDim[t] == dim) {
      num_main_entities += num_entities;
    }
    // the value of part->entities_ids_type[t] is not used
    // part->entities_ids[t] is already set to NULL
    // part->orientations[t] is already set to NULL
  }
  // Update comp
  if (comp_dim == FMS_INVALID_DIM) {
    comp->dim = dim;
  }
  comp->num_main_entities = num_main_entities;
  comp->num_parts = num_parts + 1;
  return 0;
}